

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O3

void __thiscall QThreadPrivate::QThreadPrivate(QThreadPrivate *this,QThreadData *d)

{
  QThreadData *pQVar1;
  
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  (this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QThreadPrivate_0069c4f0;
  (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  this->quitLockRef = (QAtomicInteger<int>)0x0;
  this->threadState = NotStarted;
  this->exited = false;
  this->interruptionRequested = (__atomic_base<bool>)0x0;
  this->terminated = false;
  this->waiters = 0;
  this->returnCode = -1;
  this->stackSize = 0;
  this->priority = 7;
  this->serviceLevel = Auto;
  QWaitCondition::QWaitCondition(&this->thread_done);
  this->data = d;
  (this->m_statusOrPendingObjects).data.super___atomic_base<unsigned_long_long>._M_i = 0;
  (this->objectName).d.d = (Data *)0x0;
  (this->objectName).d.ptr = (char16_t *)0x0;
  (this->objectName).d.size = 0;
  if (d == (QThreadData *)0x0) {
    pQVar1 = (QThreadData *)operator_new(0x90);
    (pQVar1->postEventList).super_QList<QPostEvent>.d.ptr = (QPostEvent *)0x0;
    (pQVar1->postEventList).super_QList<QPostEvent>.d.size = 0;
    (pQVar1->eventLoops).super_QList<QEventLoop_*>.d.size = 0;
    (pQVar1->postEventList).super_QList<QPostEvent>.d.d = (Data *)0x0;
    (pQVar1->eventLoops).super_QList<QEventLoop_*>.d.d = (Data *)0x0;
    (pQVar1->eventLoops).super_QList<QEventLoop_*>.d.ptr = (QEventLoop **)0x0;
    (pQVar1->postEventList).recursion = 0;
    (pQVar1->postEventList).startOffset = 0;
    (pQVar1->postEventList).insertionOffset = 0;
    (pQVar1->postEventList).mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    (pQVar1->thread).super_QBasicAtomicPointer<QThread>._q_value._M_b._M_p = (__pointer_type)0x0;
    (pQVar1->threadId).super_QBasicAtomicPointer<void>._q_value._M_b._M_p = (__pointer_type)0x0;
    (pQVar1->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value._M_b._M_p
         = (__pointer_type)0x0;
    (pQVar1->tls).d.d = (Data *)0x0;
    (pQVar1->tls).d.ptr = (void **)0x0;
    (pQVar1->tls).d.size = 0;
    (pQVar1->_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pQVar1->loopLevel = 0;
    pQVar1->scopeLevel = 0;
    pQVar1->quitNow = false;
    pQVar1->canWait = true;
    pQVar1->isAdopted = false;
    pQVar1->requiresCoreApplication = true;
    this->data = pQVar1;
  }
  return;
}

Assistant:

QThreadPrivate::QThreadPrivate(QThreadData *d)
    : QObjectPrivate(), data(d)
{

// INTEGRITY doesn't support self-extending stack. The default stack size for
// a pthread on INTEGRITY is too small so we have to increase the default size
// to 128K.
#ifdef Q_OS_INTEGRITY
    stackSize = 128 * 1024;
#elif defined(Q_OS_RTEMS)
    Q_CONSTINIT static bool envStackSizeOk = false;
    static const int envStackSize = qEnvironmentVariableIntValue("QT_DEFAULT_THREAD_STACK_SIZE", &envStackSizeOk);
    if (envStackSizeOk)
        stackSize = envStackSize;
#endif

#if defined (Q_OS_WIN)
    handle = 0;
    terminationEnabled = true;
    terminatePending = false;
#endif

    if (!data)
        data = new QThreadData;
}